

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void * FIX::ThreadedSocketInitiator::socketThread(void *p)

{
  ThreadedSocketInitiator *this;
  bool bVar1;
  uint uVar2;
  Session *this_00;
  SessionID *pSVar3;
  Log *pLVar4;
  ulong uVar5;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *__addr;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int __fd;
  string *psVar6;
  allocator<char> local_1f9;
  string local_1f8 [32];
  undefined4 local_1d8;
  allocator<char> local_1d1;
  string local_1d0 [32];
  socket_handle local_1b0;
  socket_handle socket;
  Session *local_1a0;
  Session *pSession;
  SessionID sessionID;
  ThreadedSocketConnection *pConnection;
  ThreadedSocketInitiator *pInitiator;
  ThreadPair *pair;
  void *p_local;
  
  this = *p;
  sessionID.m_frozenString.field_2._8_8_ = *(undefined8 *)((long)p + 8);
  this_00 = ThreadedSocketConnection::getSession
                      ((ThreadedSocketConnection *)sessionID.m_frozenString.field_2._8_8_);
  pSVar3 = Session::getSessionID(this_00);
  SessionID::SessionID((SessionID *)&pSession,pSVar3);
  __fd = (int)pSVar3;
  local_1a0 = Session::lookupSession((SessionID *)&pSession);
  local_1b0 = ThreadedSocketConnection::getSocket
                        ((ThreadedSocketConnection *)sessionID.m_frozenString.field_2._8_8_);
  if (p != (void *)0x0) {
    __fd = 0x10;
    operator_delete(p,0x10);
  }
  lock(this);
  uVar2 = ThreadedSocketConnection::connect
                    ((ThreadedSocketConnection *)sessionID.m_frozenString.field_2._8_8_,__fd,__addr,
                     in_ECX);
  if ((uVar2 & 1) == 0) {
    pLVar4 = Initiator::getLog(&this->super_Initiator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Connection failed",&local_1d1);
    (*pLVar4->_vptr_Log[6])(pLVar4,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    (**(code **)(*(long *)sessionID.m_frozenString.field_2._8_8_ + 0x18))();
    if (sessionID.m_frozenString.field_2._8_8_ != 0) {
      (**(code **)(*(long *)sessionID.m_frozenString.field_2._8_8_ + 8))();
    }
    removeThread(this,local_1b0);
    Initiator::setDisconnected(&this->super_Initiator,(SessionID *)&pSession);
  }
  else {
    Initiator::setConnected(&this->super_Initiator,(SessionID *)&pSession);
    pLVar4 = Initiator::getLog(&this->super_Initiator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1f8,"Connection succeeded",&local_1f9);
    psVar6 = local_1f8;
    (*pLVar4->_vptr_Log[6])();
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    Session::next(local_1a0);
    __buf = extraout_RDX;
    do {
      uVar5 = ThreadedSocketConnection::read
                        ((ThreadedSocketConnection *)sessionID.m_frozenString.field_2._8_8_,
                         (int)psVar6,__buf,CONCAT44(in_register_0000000c,in_ECX));
      __buf = extraout_RDX_00;
    } while ((uVar5 & 1) != 0);
    if (sessionID.m_frozenString.field_2._8_8_ != 0) {
      (**(code **)(*(long *)sessionID.m_frozenString.field_2._8_8_ + 8))();
    }
    bVar1 = Initiator::isStopped(&this->super_Initiator);
    if (!bVar1) {
      removeThread(this,local_1b0);
    }
    Initiator::setDisconnected(&this->super_Initiator,(SessionID *)&pSession);
  }
  local_1d8 = 1;
  SessionID::~SessionID((SessionID *)&pSession);
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketInitiator::socketThread( void* p )
{
  ThreadPair * pair = reinterpret_cast < ThreadPair* > ( p );

  ThreadedSocketInitiator* pInitiator = pair->first;
  ThreadedSocketConnection* pConnection = pair->second;
  FIX::SessionID sessionID = pConnection->getSession()->getSessionID();
  FIX::Session* pSession = FIX::Session::lookupSession( sessionID );
  socket_handle socket = pConnection->getSocket();
  delete pair;

  pInitiator->lock();

  if( !pConnection->connect() )
  {
    pInitiator->getLog()->onEvent( "Connection failed" );
    pConnection->disconnect();
    delete pConnection;
    pInitiator->removeThread( socket );
    pInitiator->setDisconnected( sessionID );
    return 0;
  }

  pInitiator->setConnected( sessionID );
  pInitiator->getLog()->onEvent( "Connection succeeded" );

  pSession->next();

  while ( pConnection->read() ) {}

  delete pConnection;
  if( !pInitiator->isStopped() )
    pInitiator->removeThread( socket );
  
  pInitiator->setDisconnected( sessionID );
  return 0;
}